

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O1

void __thiscall
TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test::
~TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test
          (TEST_TestMemoryAccountant_countAllocationsPerSizeMultipleAllocations_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupTestMemoryAccountant_003884c0;
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)
             &(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).testFunction);
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).fixture);
  MemoryAccountant::~MemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupTestMemoryAccountant).accountant);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST(TestMemoryAccountant, countAllocationsPerSizeMultipleAllocations)
{
    accountant.alloc(4);
    accountant.alloc(4);
    accountant.alloc(8);
    LONGS_EQUAL(2, accountant.totalAllocationsOfSize(4));
    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(8));
    LONGS_EQUAL(0, accountant.totalAllocationsOfSize(10));
    LONGS_EQUAL(3, accountant.totalAllocations());
}